

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O2

void __thiscall Uniforms::printAvailableUniforms(Uniforms *this,bool _non_active)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  undefined7 in_register_00000031;
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var2 = (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->functions)._M_t._M_impl.super__Rb_tree_header;
  if ((int)CONCAT71(in_register_00000031,_non_active) == 0) {
    for (; (_Rb_tree_header *)p_Var2 != p_Var3; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2))
    {
      if ((char)p_Var2[5]._M_color == _S_black) {
        poVar1 = std::operator<<((ostream *)&std::cout,"uniform ");
        poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 4));
        poVar1 = std::operator<<(poVar1,' ');
        poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 1));
        std::operator<<(poVar1,";");
        if (p_Var2[3]._M_left != (_Base_ptr)0x0) {
          poVar1 = std::operator<<((ostream *)&std::cout," // ");
          std::
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          ::operator()(&local_50,
                       (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                        *)(p_Var2 + 3));
          std::operator<<(poVar1,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
    }
  }
  else {
    for (; (_Rb_tree_header *)p_Var2 != p_Var3; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2))
    {
      poVar1 = std::operator<<((ostream *)&std::cout,"uniform ");
      poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 4));
      poVar1 = std::operator<<(poVar1,' ');
      poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 1));
      std::operator<<(poVar1,";");
      if (p_Var2[3]._M_left != (_Base_ptr)0x0) {
        poVar1 = std::operator<<((ostream *)&std::cout," // ");
        std::
        function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
        ::operator()(&local_50,
                     (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                      *)(p_Var2 + 3));
        std::operator<<(poVar1,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
  }
  return;
}

Assistant:

void Uniforms::printAvailableUniforms(bool _non_active) {
    if (_non_active) {
        // Print all Native Uniforms (they carry functions)
        for (UniformFunctionsMap::iterator it= functions.begin(); it != functions.end(); ++it) {                
            std::cout << "uniform " << it->second.type << ' ' << it->first << ";";
            if (it->second.print) 
                std::cout << " // " << it->second.print();
            std::cout << std::endl;
        }
    }
    else {
        // Print Native Uniforms (they carry functions) that are present on the shader
        for (UniformFunctionsMap::iterator it= functions.begin(); it != functions.end(); ++it) {                
            if (it->second.present) {
                std::cout<< "uniform " << it->second.type << ' ' << it->first << ";";
                if (it->second.print)
                    std::cout << " // " << it->second.print();
                std::cout << std::endl;
            }
        }
    }
}